

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
::dense_hashtable(dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
                  *this,dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
                        *ht,size_type min_buckets_wanted)

{
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *this_00;
  size_type in_RDX;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *in_RSI;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  size_type in_stack_00000010;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000018;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000020;
  size_type in_stack_ffffffffffffffa8;
  sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffe0;
  
  memcpy(in_RDI,in_RSI,0x30);
  iVar1 = (in_RSI->key_info).super_Hasher.num_hashes_;
  (in_RDI->key_info).super_Hasher.id_ = (in_RSI->key_info).super_Hasher.id_;
  (in_RDI->key_info).super_Hasher.num_hashes_ = iVar1;
  *(undefined8 *)&(in_RDI->key_info).super_Hasher.num_compares_ =
       *(undefined8 *)&(in_RSI->key_info).super_Hasher.num_compares_;
  (in_RDI->key_info).delkey = (in_RSI->key_info).delkey;
  (in_RDI->key_info).empty_key = (in_RSI->key_info).empty_key;
  in_RDI->num_deleted = 0;
  in_RDI->num_elements = 0;
  in_RDI->num_buckets = 0;
  uVar2 = *(undefined4 *)
           &(in_RSI->val_info).
            super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
            super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.field_0x4;
  (in_RDI->val_info).super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.id_ =
       (in_RSI->val_info).
       super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
       super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.id_;
  *(undefined4 *)
   &(in_RDI->val_info).super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    .super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.field_0x4 = uVar2;
  (in_RDI->val_info).super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_ =
       (in_RSI->val_info).
       super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
       super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_;
  in_RDI->table = (pointer)0x0;
  bVar3 = sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
          use_empty((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)in_RSI);
  if (bVar3) {
    bucket_count(in_RDI);
    sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
    reset_thresholds(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
    ::
    copy_or_move_from<google::dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>>
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  }
  else {
    size(in_RSI);
    this_00 = (sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)
              sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
              min_buckets((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)in_RSI,
                          in_RDX,in_stack_ffffffffffffffe0);
    in_RDI->num_buckets = (size_type)this_00;
    bucket_count(in_RDI);
    sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
    reset_thresholds(this_00,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

dense_hashtable(dense_hashtable&& ht,
                  size_type min_buckets_wanted)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(std::move(ht.val_info)),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_or_move_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(std::move(ht), min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }